

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

int __thiscall
TPZFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontNonSym<std::complex<float>_>_>
::Subst_Backward(TPZFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontNonSym<std::complex<float>_>_>
                 *this,TPZFMatrix<std::complex<float>_> *b)

{
  undefined8 in_RSI;
  TPZFMatrix<std::complex<float>_> *in_RDI;
  TPZStackEqnStorage<std::complex<float>_> *unaff_retaddr;
  DecomposeType dec;
  DecomposeType dec_00;
  TPZFMatrix<std::complex<float>_> *f;
  
  dec_00 = (DecomposeType)((ulong)in_RSI >> 0x20);
  f = in_RDI;
  std::operator<<((ostream *)&std::cout,"Entering Backward Substitution\n");
  std::ostream::flush();
  TPZFront<std::complex<float>_>::GetDecomposeType
            ((TPZFront<std::complex<float>_> *)&in_RDI[899].fPivot);
  TPZStackEqnStorage<std::complex<float>_>::Backward(unaff_retaddr,f,dec_00);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::Subst_Backward(TPZFMatrix<TVar> *b) const {
	cout << "Entering Backward Substitution\n";
	cout.flush();
	DecomposeType dec = fFront.GetDecomposeType();
//	if(dec != ECholesky) cout << "TPZFrontMatrix::Subst_Forward non matching decomposition\n";
	fStorage.Backward(*b, dec);
	return 1;
}